

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O3

void __thiscall
rtb::Filter::Polynomial<double>::Polynomial
          (Polynomial<double> *this,vector<double,_std::allocator<double>_> *coefficients)

{
  pointer *ppcVar1;
  pointer pdVar2;
  iterator __position;
  size_t sVar3;
  pointer pdVar4;
  double local_30 [2];
  
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar4 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar2) {
    do {
      local_30[0] = *pdVar4;
      local_30[1] = 0.0;
      __position._M_current =
           (this->coefficients_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->coefficients_).
          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        _M_realloc_insert<std::complex<double>>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)this,
                   __position,(complex<double> *)local_30);
      }
      else {
        *(double *)(__position._M_current)->_M_value = local_30[0];
        *(undefined8 *)((__position._M_current)->_M_value + 8) = 0;
        ppcVar1 = &(this->coefficients_).
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
  }
  removeHighOrderZeroCoefficients(this);
  sVar3 = (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  this->size_ = sVar3;
  this->order_ = sVar3 - 1;
  return;
}

Assistant:

Polynomial<T>::Polynomial(const std::vector<T>& coefficients)
        {
            for (auto c : coefficients)
                coefficients_.push_back(c);

            removeHighOrderZeroCoefficients();
            updateOrderAndSize();
        }